

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Generators::Generators<int>::populate(Generators<int> *this,int *val)

{
  IGenerator<int> *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_Catch::Generators::IGenerator<int>_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  value<int>((Generators *)&local_18,val);
  std::
  vector<Catch::Generators::GeneratorWrapper<int>,std::allocator<Catch::Generators::GeneratorWrapper<int>>>
  ::emplace_back<Catch::Generators::GeneratorWrapper<int>>
            ((vector<Catch::Generators::GeneratorWrapper<int>,std::allocator<Catch::Generators::GeneratorWrapper<int>>>
              *)&this->m_generators,(GeneratorWrapper<int> *)&local_18);
  if (local_18._M_head_impl != (IGenerator<int> *)0x0) {
    (*((local_18._M_head_impl)->super_GeneratorUntypedBase)._vptr_GeneratorUntypedBase[1])();
  }
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }